

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

bool __thiscall QMdiSubWindow::eventFilter(QMdiSubWindow *this,QObject *object,QEvent *event)

{
  QFlags<Qt::WindowState> other;
  QLatin1StringView s;
  Representation RVar1;
  byte bVar2;
  bool bVar3;
  SubControl SVar4;
  int iVar5;
  int iVar6;
  Type TVar7;
  Int IVar8;
  QMdiSubWindowPrivate *pQVar9;
  QAction *pQVar10;
  QObject *pQVar11;
  QSizeGrip *pQVar12;
  QRect *pQVar13;
  ulong uVar14;
  QWidget *pQVar15;
  QMenuBar *pQVar16;
  QWidget *pQVar17;
  Operation OVar18;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool windowModified;
  QWindowStateChangeEvent *changeEvent;
  QMouseEvent *mouseEvent_2;
  QMouseEvent *mouseEvent_1;
  QAction *action;
  QMouseEvent *mouseEvent;
  QMdiSubWindowPrivate *d;
  WindowStates newState;
  WindowStates oldState;
  undefined2 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3a;
  undefined1 in_stack_fffffffffffffe3b;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  QWidget *in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4a;
  undefined1 uVar19;
  undefined1 in_stack_fffffffffffffe4b;
  undefined1 uVar20;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar21;
  Corner in_stack_fffffffffffffe54;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  QMdiSubWindowPrivate *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  byte bVar23;
  undefined8 in_stack_fffffffffffffea8;
  undefined2 uVar24;
  QMdiSubWindowPrivate *in_stack_fffffffffffffeb0;
  bool local_121;
  QFlagsStorageHelper<Qt::WindowState,_4> local_8c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_88;
  QFlagsStorageHelper<Qt::WindowState,_4> local_84;
  QFlagsStorageHelper<Qt::WindowState,_4> local_80;
  QFlagsStorageHelper<Qt::WindowState,_4> local_7c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_78;
  QFlagsStorageHelper<Qt::WindowState,_4> local_74;
  QPointF local_70;
  QPoint local_60;
  QPoint local_58;
  QRegion local_50;
  QPointF local_48;
  QPoint local_38;
  QPoint local_30;
  QPointF local_28;
  QPoint local_18;
  QEvent *local_10;
  long local_8;
  
  uVar24 = (undefined2)((ulong)in_stack_fffffffffffffea8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  pQVar9 = d_func((QMdiSubWindow *)0x633cb6);
  if (local_10 == (QEvent *)0x0) {
    bVar2 = QObject::eventFilter(&in_RDI->super_QObject,(QEvent *)0x0);
    local_121 = (bool)(bVar2 & 1);
  }
  else {
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x633d05);
    if ((bVar3) &&
       (bVar3 = ::operator==((QPointer<QMenu> *)in_stack_fffffffffffffe40,
                             (QObject **)
                             CONCAT17(in_stack_fffffffffffffe3f,
                                      CONCAT16(in_stack_fffffffffffffe3e,
                                               CONCAT15(in_stack_fffffffffffffe3d,
                                                        CONCAT14(in_stack_fffffffffffffe3c,
                                                                 CONCAT13(in_stack_fffffffffffffe3b,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe3a,
                                                  in_stack_fffffffffffffe38))))))), bVar3)) {
      TVar7 = QEvent::type(in_RDX);
      if (TVar7 == MouseButtonDblClick) {
        QPointer<QMenu>::operator->((QPointer<QMenu> *)0x633d6d);
        local_28 = QSinglePointEvent::position((QSinglePointEvent *)0x633d7f);
        local_18 = QPointF::toPoint((QPointF *)
                                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        iVar5 = (int)&local_18;
        pQVar10 = QMenu::actionAt((QMenu *)CONCAT44(in_stack_fffffffffffffe4c,
                                                    CONCAT13(in_stack_fffffffffffffe4b,
                                                             CONCAT12(in_stack_fffffffffffffe4a,
                                                                      in_stack_fffffffffffffe48))),
                                  (QPoint *)in_stack_fffffffffffffe40);
        if ((pQVar10 == (QAction *)0x0) || (uVar14 = QAction::isEnabled(), (uVar14 & 1) != 0)) {
          QWidget::close(in_RDI,iVar5);
        }
      }
      else {
        TVar7 = QEvent::type(in_RDX);
        if (TVar7 == MouseMove) {
          local_48 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x633e1e);
          local_38 = QPointF::toPoint((QPointF *)
                                      CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))
          ;
          local_30 = QWidget::mapFromGlobal
                               ((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                (QPoint *)
                                CONCAT44(in_stack_fffffffffffffe4c,
                                         CONCAT13(in_stack_fffffffffffffe4b,
                                                  CONCAT12(in_stack_fffffffffffffe4a,
                                                           in_stack_fffffffffffffe48))));
          SVar4 = QMdiSubWindowPrivate::getSubControl
                            ((QMdiSubWindowPrivate *)
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             (QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                            );
          pQVar9->hoveredSubControl = SVar4;
        }
        else {
          TVar7 = QEvent::type(in_RDX);
          if (TVar7 == Hide) {
            pQVar9->activeSubControl = SC_None;
            iVar5 = QWidget::width((QWidget *)0x633eb1);
            iVar6 = QMdiSubWindowPrivate::titleBarHeight
                              ((QMdiSubWindowPrivate *)CONCAT44(iVar5,in_stack_fffffffffffffe58));
            QRegion::QRegion(&local_50,0,0,iVar5,iVar6,Rectangle);
            QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                            ,(QRegion *)
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
            QRegion::~QRegion(&local_50);
          }
        }
      }
      bVar2 = QObject::eventFilter(&in_RDI->super_QObject,local_10);
      local_121 = (bool)(bVar2 & 1);
    }
    else {
      bVar3 = ::operator!=((QObject **)in_stack_fffffffffffffe40,
                           (QPointer<QWidget> *)
                           CONCAT17(in_stack_fffffffffffffe3f,
                                    CONCAT16(in_stack_fffffffffffffe3e,
                                             CONCAT15(in_stack_fffffffffffffe3d,
                                                      CONCAT14(in_stack_fffffffffffffe3c,
                                                               CONCAT13(in_stack_fffffffffffffe3b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe3a,
                                                  in_stack_fffffffffffffe38)))))));
      if (((bVar3) && (pQVar11 = QObject::parent((QObject *)0x633f59), pQVar11 != (QObject *)0x0))
         && (pQVar12 = qobject_cast<QSizeGrip*>((QObject *)0x633f70), pQVar12 != (QSizeGrip *)0x0))
      {
        TVar7 = QEvent::type(in_RDX);
        if ((TVar7 == MouseButtonPress) &&
           (bVar3 = testOption((QMdiSubWindow *)in_stack_fffffffffffffe40,
                               CONCAT13(in_stack_fffffffffffffe3f,
                                        CONCAT12(in_stack_fffffffffffffe3e,
                                                 CONCAT11(in_stack_fffffffffffffe3d,
                                                          in_stack_fffffffffffffe3c)))), bVar3)) {
          pQVar15 = QWidget::parentWidget((QWidget *)0x633fde);
          uVar21 = SUB84(pQVar15,0);
          uVar22 = (undefined4)((ulong)pQVar15 >> 0x20);
          local_70 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x633fed);
          local_60 = QPointF::toPoint((QPointF *)CONCAT44(uVar22,uVar21));
          local_58 = QWidget::mapFromGlobal
                               ((QWidget *)CONCAT44(uVar22,uVar21),
                                (QPoint *)
                                CONCAT44(in_stack_fffffffffffffe4c,
                                         CONCAT13(in_stack_fffffffffffffe4b,
                                                  CONCAT12(in_stack_fffffffffffffe4a,
                                                           in_stack_fffffffffffffe48))));
          pQVar9->mousePressPosition = local_58;
          pQVar13 = QWidget::geometry(in_RDI);
          RVar1.m_i = (pQVar13->y1).m_i;
          (pQVar9->oldGeometry).x1 = (Representation)(pQVar13->x1).m_i;
          (pQVar9->oldGeometry).y1 = (Representation)RVar1.m_i;
          RVar1.m_i = (pQVar13->y2).m_i;
          (pQVar9->oldGeometry).x2 = (Representation)(pQVar13->x2).m_i;
          (pQVar9->oldGeometry).y2 = (Representation)RVar1.m_i;
          bVar3 = QWidget::isLeftToRight((QWidget *)0x634079);
          OVar18 = BottomLeftResize;
          if (bVar3) {
            OVar18 = BottomRightResize;
          }
          pQVar9->currentOperation = OVar18;
          QMdiSubWindowPrivate::enterRubberBandMode
                    ((QMdiSubWindowPrivate *)
                     CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
          local_121 = true;
        }
        else {
          bVar2 = QObject::eventFilter(&in_RDI->super_QObject,local_10);
          local_121 = (bool)(bVar2 & 1);
        }
      }
      else {
        bVar3 = ::operator!=((QObject **)in_stack_fffffffffffffe40,
                             (QPointer<QWidget> *)
                             CONCAT17(in_stack_fffffffffffffe3f,
                                      CONCAT16(in_stack_fffffffffffffe3e,
                                               CONCAT15(in_stack_fffffffffffffe3d,
                                                        CONCAT14(in_stack_fffffffffffffe3c,
                                                                 CONCAT13(in_stack_fffffffffffffe3b,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe3a,
                                                  in_stack_fffffffffffffe38)))))));
        if ((bVar3) && (TVar7 = QEvent::type(in_RDX), TVar7 != WindowTitleChange)) {
          bVar2 = QObject::eventFilter(&in_RDI->super_QObject,local_10);
          local_121 = (bool)(bVar2 & 1);
        }
        else {
          TVar7 = QEvent::type(in_RDX);
          if (TVar7 == Enter) {
            pQVar9->currentOperation = None;
            QMdiSubWindowPrivate::updateCursor
                      ((QMdiSubWindowPrivate *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          }
          else if (TVar7 == Show) {
            QMdiSubWindowPrivate::setActive
                      (in_stack_fffffffffffffeb0,SUB21((ushort)uVar24 >> 8,0),SUB21(uVar24,0));
          }
          else if (TVar7 == ShowToParent) {
            if ((pQVar9->isWidgetHiddenByUs & 1U) == 0) {
              QWidget::show((QWidget *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           );
            }
          }
          else if (TVar7 == WindowTitleChange) {
            if ((pQVar9->ignoreWindowTitleChange & 1U) == 0) {
              bVar3 = ::operator==((QObject **)in_stack_fffffffffffffe40,
                                   (QPointer<QWidget> *)
                                   CONCAT17(in_stack_fffffffffffffe3f,
                                            CONCAT16(in_stack_fffffffffffffe3e,
                                                     CONCAT15(in_stack_fffffffffffffe3d,
                                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffe3b,
                                                  CONCAT12(in_stack_fffffffffffffe3a,
                                                           in_stack_fffffffffffffe38)))))));
              if (bVar3) {
                QMdiSubWindowPrivate::updateWindowTitle
                          (in_stack_fffffffffffffe78,SUB81((ulong)in_RDI >> 0x38,0));
                QPointer<QWidget>::operator->((QPointer<QWidget> *)0x63441e);
                QWidget::windowTitle
                          ((QWidget *)
                           CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                   CONCAT12(in_stack_fffffffffffffe4a,
                                                            in_stack_fffffffffffffe48))));
                QString::operator=((QString *)in_stack_fffffffffffffe40,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffffe3f,
                                            CONCAT16(in_stack_fffffffffffffe3e,
                                                     CONCAT15(in_stack_fffffffffffffe3d,
                                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffe3b,
                                                  CONCAT12(in_stack_fffffffffffffe3a,
                                                           in_stack_fffffffffffffe38)))))));
                QString::~QString((QString *)0x634457);
              }
              else {
                pQVar15 = maximizedButtonsWidget
                                    ((QMdiSubWindow *)
                                     CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                             CONCAT12(in_stack_fffffffffffffe4a,
                                                                      in_stack_fffffffffffffe48))));
                if (pQVar15 != (QWidget *)0x0) {
                  QPointer<QMdi::ControlContainer>::operator->
                            ((QPointer<QMdi::ControlContainer> *)0x634484);
                  pQVar16 = QMdi::ControlContainer::menuBar((ControlContainer *)0x63448c);
                  if (pQVar16 != (QMenuBar *)0x0) {
                    QPointer<QMdi::ControlContainer>::operator->
                              ((QPointer<QMdi::ControlContainer> *)0x6344aa);
                    QMdi::ControlContainer::menuBar((ControlContainer *)0x6344b2);
                    pQVar15 = QMenuBar::cornerWidget
                                        ((QMenuBar *)
                                         CONCAT44(in_stack_fffffffffffffe5c,
                                                  in_stack_fffffffffffffe58),
                                         in_stack_fffffffffffffe54);
                    pQVar17 = maximizedButtonsWidget
                                        ((QMdiSubWindow *)
                                         CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                                 CONCAT12(in_stack_fffffffffffffe4a,
                                                                          in_stack_fffffffffffffe48)
                                                                )));
                    if (pQVar15 == pQVar17) {
                      QString::clear((QString *)pQVar15);
                      bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x634507);
                      bVar2 = 0;
                      if (bVar3) {
                        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x634534);
                        QWidget::windowTitle
                                  ((QWidget *)
                                   CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                           CONCAT12(in_stack_fffffffffffffe4a,
                                                                    in_stack_fffffffffffffe48))));
                        QWidget::windowTitle
                                  ((QWidget *)
                                   CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                           CONCAT12(in_stack_fffffffffffffe4a,
                                                                    in_stack_fffffffffffffe48))));
                        bVar2 = ::operator==((QString *)pQVar15,
                                             (QString *)
                                             CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe3e,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe3d,
                                                  CONCAT14(in_stack_fffffffffffffe3c,
                                                           CONCAT13(in_stack_fffffffffffffe3b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe3a,
                                                  in_stack_fffffffffffffe38)))))));
                        QString::~QString((QString *)0x634597);
                        QString::~QString((QString *)0x6345ad);
                      }
                      bVar3 = SUB81((ulong)in_RDI >> 0x38,0);
                      if ((bVar2 & 1) == 0) {
                        QMdiSubWindowPrivate::updateWindowTitle(in_stack_fffffffffffffe78,bVar3);
                      }
                      else {
                        QMdiSubWindowPrivate::updateWindowTitle(in_stack_fffffffffffffe78,bVar3);
                      }
                    }
                  }
                }
              }
            }
          }
          else if (TVar7 == LayoutRequest) {
            QMdiSubWindowPrivate::updateGeometryConstraints
                      ((QMdiSubWindowPrivate *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          }
          else if (TVar7 == ModifiedChange) {
            bVar3 = ::operator!=((QObject **)in_stack_fffffffffffffe40,
                                 (QPointer<QWidget> *)
                                 CONCAT17(in_stack_fffffffffffffe3f,
                                          CONCAT16(in_stack_fffffffffffffe3e,
                                                   CONCAT15(in_stack_fffffffffffffe3d,
                                                            CONCAT14(in_stack_fffffffffffffe3c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffe3b,
                                                  CONCAT12(in_stack_fffffffffffffe3a,
                                                           in_stack_fffffffffffffe38)))))));
            if (!bVar3) {
              QPointer<QWidget>::operator->((QPointer<QWidget> *)0x63461e);
              bVar3 = QWidget::isWindowModified((QWidget *)0x634626);
              bVar23 = 0;
              bVar2 = false;
              if (!bVar3) {
                QPointer<QWidget>::operator->((QPointer<QWidget> *)0x634659);
                QWidget::windowTitle
                          ((QWidget *)
                           CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                   CONCAT12(in_stack_fffffffffffffe4a,
                                                            in_stack_fffffffffffffe48))));
                QWidget::windowTitle
                          ((QWidget *)
                           CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                   CONCAT12(in_stack_fffffffffffffe4a,
                                                            in_stack_fffffffffffffe48))));
                bVar23 = 1;
                bVar2 = ::operator!=((QString *)in_stack_fffffffffffffe40,
                                     (QString *)
                                     CONCAT17(in_stack_fffffffffffffe3f,
                                              CONCAT16(in_stack_fffffffffffffe3e,
                                                       CONCAT15(bVar2,CONCAT14(
                                                  in_stack_fffffffffffffe3c,
                                                  CONCAT13(in_stack_fffffffffffffe3b,
                                                           CONCAT12(in_stack_fffffffffffffe3a,
                                                                    in_stack_fffffffffffffe38)))))))
                ;
              }
              uVar20 = bVar2;
              if ((bVar23 & 1) != 0) {
                QString::~QString((QString *)0x6346bc);
              }
              if (!bVar3) {
                QString::~QString((QString *)0x6346d2);
              }
              if ((bVar2 & 1) == 0) {
                QWidget::windowTitle
                          ((QWidget *)
                           CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                   CONCAT12(in_stack_fffffffffffffe4a,
                                                            in_stack_fffffffffffffe48))));
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(TVar7,CONCAT13(in_stack_fffffffffffffe4b,
                                                           CONCAT12(in_stack_fffffffffffffe4a,
                                                                    in_stack_fffffffffffffe48))),
                           (size_t)in_stack_fffffffffffffe40);
                s.m_size._4_4_ = in_stack_fffffffffffffe54;
                s.m_size._0_4_ = in_stack_fffffffffffffe50;
                s.m_data._0_4_ = in_stack_fffffffffffffe58;
                s.m_data._4_4_ = in_stack_fffffffffffffe5c;
                bVar2 = QString::contains((QString *)
                                          CONCAT17(in_stack_fffffffffffffe3f,
                                                   CONCAT16(in_stack_fffffffffffffe3e,
                                                            CONCAT15(uVar20,CONCAT14(bVar2,CONCAT13(
                                                  in_stack_fffffffffffffe3b,
                                                  CONCAT12(in_stack_fffffffffffffe3a,
                                                           in_stack_fffffffffffffe38)))))),s,
                                          CaseInsensitive);
                uVar20 = (undefined1)(in_stack_fffffffffffffe54 >> 0x18);
                QString::~QString((QString *)0x634738);
                if ((bVar2 & 1) != 0) {
                  QWidget::setWindowModified
                            ((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             (bool)uVar20);
                }
              }
            }
          }
          else if ((TVar7 == WindowStateChange) &&
                  (uVar14 = QWindowStateChangeEvent::isOverride(), (uVar14 & 1) == 0)) {
            local_74.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
            local_74.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)
                 QWindowStateChangeEvent::oldState
                           ((QWindowStateChangeEvent *)in_stack_fffffffffffffe40);
            local_78.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
            QPointer<QWidget>::operator->((QPointer<QWidget> *)0x634218);
            local_78.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)QWidget::windowState(in_stack_fffffffffffffe40);
            local_7c.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)
                 QFlags<Qt::WindowState>::operator&
                           ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffe40,
                            CONCAT13(in_stack_fffffffffffffe3f,
                                     CONCAT12(in_stack_fffffffffffffe3e,
                                              CONCAT11(in_stack_fffffffffffffe3d,
                                                       in_stack_fffffffffffffe3c))));
            bVar3 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_7c);
            uVar20 = false;
            if (bVar3) {
              local_80.super_QFlagsStorage<Qt::WindowState>.i =
                   (QFlagsStorage<Qt::WindowState>)
                   QFlags<Qt::WindowState>::operator&
                             ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffe40,
                              CONCAT13(in_stack_fffffffffffffe3f,
                                       CONCAT12(in_stack_fffffffffffffe3e,
                                                CONCAT11(in_stack_fffffffffffffe3d,
                                                         in_stack_fffffffffffffe3c))));
              IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_80);
              uVar20 = IVar8 != 0;
            }
            if ((bool)uVar20 == false) {
              local_84.super_QFlagsStorage<Qt::WindowState>.i =
                   (QFlagsStorage<Qt::WindowState>)
                   QFlags<Qt::WindowState>::operator&
                             ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffe40,
                              CONCAT13(in_stack_fffffffffffffe3f,
                                       CONCAT12(in_stack_fffffffffffffe3e,
                                                CONCAT11(in_stack_fffffffffffffe3d,
                                                         in_stack_fffffffffffffe3c))));
              bVar3 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_84);
              uVar19 = false;
              if (bVar3) {
                local_88.super_QFlagsStorage<Qt::WindowState>.i =
                     (QFlagsStorage<Qt::WindowState>)
                     QFlags<Qt::WindowState>::operator&
                               ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffe40,
                                CONCAT13(in_stack_fffffffffffffe3f,
                                         CONCAT12(in_stack_fffffffffffffe3e,
                                                  CONCAT11(in_stack_fffffffffffffe3d,
                                                           in_stack_fffffffffffffe3c))));
                IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_88);
                uVar19 = IVar8 != 0;
              }
              if ((bool)uVar19 == false) {
                Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                              (enum_type)in_stack_fffffffffffffe40);
                QFlags<Qt::WindowState>::operator|
                          ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffe40,
                           CONCAT13(in_stack_fffffffffffffe3f,
                                    CONCAT12(in_stack_fffffffffffffe3e,
                                             CONCAT11(in_stack_fffffffffffffe3d,
                                                      in_stack_fffffffffffffe3c))));
                other.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                super_QFlagsStorage<Qt::WindowState>.i._2_1_ = uVar19;
                other.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                super_QFlagsStorage<Qt::WindowState>.i._0_2_ = in_stack_fffffffffffffe48;
                other.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                super_QFlagsStorage<Qt::WindowState>.i._3_1_ = uVar20;
                local_8c.super_QFlagsStorage<Qt::WindowState>.i =
                     (QFlagsStorage<Qt::WindowState>)
                     QFlags<Qt::WindowState>::operator&
                               ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffe40,other);
                bVar3 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_8c);
                if (bVar3) {
                  QWidget::showNormal((QWidget *)
                                      CONCAT44(TVar7,CONCAT13(uVar20,CONCAT12(uVar19,
                                                  in_stack_fffffffffffffe48))));
                }
              }
              else {
                QWidget::showMaximized
                          ((QWidget *)
                           CONCAT44(TVar7,CONCAT13(uVar20,CONCAT12(uVar19,in_stack_fffffffffffffe48)
                                                  )));
              }
            }
            else {
              QWidget::showMinimized(in_stack_fffffffffffffe40);
            }
          }
          bVar2 = QObject::eventFilter(&in_RDI->super_QObject,local_10);
          local_121 = (bool)(bVar2 & 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_121;
  }
  __stack_chk_fail();
}

Assistant:

bool QMdiSubWindow::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QMdiSubWindow);
    if (!object)
        return QWidget::eventFilter(object, event);

#if QT_CONFIG(menu)
    // System menu events.
    if (d->systemMenu && d->systemMenu == object) {
        if (event->type() == QEvent::MouseButtonDblClick) {
            const QMouseEvent *mouseEvent = static_cast<const QMouseEvent *>(event);
            const QAction *action = d->systemMenu->actionAt(mouseEvent->position().toPoint());
            if (!action || action->isEnabled())
                close();
        } else if (event->type() == QEvent::MouseMove) {
            QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
            d->hoveredSubControl = d->getSubControl(mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        } else if (event->type() == QEvent::Hide) {
            d->activeSubControl = QStyle::SC_None;
            update(QRegion(0, 0, width(), d->titleBarHeight()));
        }
        return QWidget::eventFilter(object, event);
    }
#endif

#if QT_CONFIG(sizegrip)
    if (object != d->baseWidget && parent() && qobject_cast<QSizeGrip *>(object)) {
        if (event->type() != QEvent::MouseButtonPress || !testOption(QMdiSubWindow::RubberBandResize))
            return QWidget::eventFilter(object, event);
        const QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
        d->mousePressPosition = parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint());
        d->oldGeometry = geometry();
        d->currentOperation = isLeftToRight() ? QMdiSubWindowPrivate::BottomRightResize
                                              : QMdiSubWindowPrivate::BottomLeftResize;
#if QT_CONFIG(rubberband)
        d->enterRubberBandMode();
#endif
        return true;
    }
#endif

    if (object != d->baseWidget && event->type() != QEvent::WindowTitleChange)
        return QWidget::eventFilter(object, event);

    switch (event->type()) {
    case QEvent::Show:
        d->setActive(true);
        break;
    case QEvent::ShowToParent:
        if (!d->isWidgetHiddenByUs)
            show();
        break;
    case QEvent::WindowStateChange: {
        QWindowStateChangeEvent *changeEvent = static_cast<QWindowStateChangeEvent*>(event);
        if (changeEvent->isOverride())
            break;
        Qt::WindowStates oldState = changeEvent->oldState();
        Qt::WindowStates newState = d->baseWidget->windowState();
        if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
            showMinimized();
        else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
            showMaximized();
        else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
            showNormal();
        break;
    }
    case QEvent::Enter:
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->updateCursor();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowTitleChange:
        if (d->ignoreWindowTitleChange)
            break;
        if (object == d->baseWidget) {
            d->updateWindowTitle(true);
            d->lastChildWindowTitle = d->baseWidget->windowTitle();
#if QT_CONFIG(menubar)
        } else if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                   ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            d->originalTitle.clear();
            if (d->baseWidget && d->baseWidget->windowTitle() == windowTitle())
                d->updateWindowTitle(true);
            else
                d->updateWindowTitle(false);
#endif
        }
        break;
    case QEvent::ModifiedChange: {
        if (object != d->baseWidget)
            break;
        bool windowModified = d->baseWidget->isWindowModified();
        if (!windowModified && d->baseWidget->windowTitle() != windowTitle())
            break;
        if (windowTitle().contains("[*]"_L1))
            setWindowModified(windowModified);
        break;
    }
    default:
        break;
    }
    return QWidget::eventFilter(object, event);
}